

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

void dispose_chunk(mstate m,mchunkptr p,size_t psize)

{
  malloc_tree_chunk *pmVar1;
  malloc_tree_chunk *pmVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  tbinptr pmVar7;
  size_t __len;
  ulong uVar8;
  tchunkptr pmVar9;
  tbinptr *ppmVar10;
  size_t *psVar11;
  byte bVar12;
  bool bVar13;
  tchunkptr F_5;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I_3;
  tbinptr *H_2;
  tchunkptr TP_2;
  mchunkptr F_4;
  mchunkptr B_2;
  bindex_t I_2;
  tchunkptr C1_1;
  tchunkptr C0_1;
  tbinptr *H_1;
  tchunkptr *CP_1;
  tchunkptr *RP_1;
  tchunkptr F_3;
  tchunkptr R_1;
  tchunkptr XP_1;
  tchunkptr TP_1;
  bindex_t I_1;
  mchunkptr B_1;
  mchunkptr F_2;
  size_t nsize;
  size_t dsize;
  size_t tsize;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F_1;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr TP;
  bindex_t I;
  mchunkptr B;
  mchunkptr F;
  size_t prevsize;
  mchunkptr prev;
  mchunkptr next;
  size_t psize_local;
  mchunkptr p_local;
  mstate m_local;
  
  pmVar7 = (tbinptr)((long)&p->prev_foot + psize);
  next = (mchunkptr)psize;
  psize_local = (size_t)p;
  if ((p->head & 1) == 0) {
    uVar8 = p->prev_foot;
    if ((p->head & 3) == 0) {
      __len = uVar8 + 0x20 + psize;
      iVar5 = munmap((void *)((long)p - uVar8),__len);
      if (iVar5 != 0) {
        return;
      }
      m->footprint = m->footprint - __len;
      return;
    }
    psize_local = (long)p - uVar8;
    next = (mchunkptr)(uVar8 + psize);
    if (psize_local < (tbinptr)m->least_addr) {
      abort();
    }
    if ((tbinptr)psize_local == (tbinptr)m->dv) {
      if ((pmVar7->head & 3) == 3) {
        m->dvsize = (size_t)next;
        pmVar7->head = pmVar7->head & 0xfffffffffffffffe;
        ((tbinptr)psize_local)->head = (ulong)next | 1;
        *(mchunkptr *)((long)&next[-1].prev_foot + (long)((tbinptr)psize_local)->child) = next;
        return;
      }
    }
    else if (uVar8 >> 3 < 0x20) {
      pmVar1 = ((tbinptr)psize_local)->fd;
      pmVar2 = ((tbinptr)psize_local)->bk;
      iVar5 = (int)(uVar8 >> 3);
      bVar13 = true;
      if ((pmVar1 != (malloc_tree_chunk *)(m->smallbins + (uint)(iVar5 << 1))) &&
         (bVar13 = false, (malloc_tree_chunk *)m->least_addr <= pmVar1)) {
        bVar13 = pmVar1->bk == (tbinptr)psize_local;
      }
      if (!bVar13) {
        abort();
      }
      if (pmVar2 == pmVar1) {
        m->smallmap = (1 << ((byte)(uVar8 >> 3) & 0x1f) ^ 0xffffffffU) & m->smallmap;
      }
      else {
        bVar13 = true;
        if ((pmVar2 != (malloc_tree_chunk *)(m->smallbins + (uint)(iVar5 << 1))) &&
           (bVar13 = false, (malloc_tree_chunk *)m->least_addr <= pmVar2)) {
          bVar13 = pmVar2->fd == (tbinptr)psize_local;
        }
        if (!bVar13) {
          abort();
        }
        pmVar1->bk = pmVar2;
        pmVar2->fd = pmVar1;
      }
    }
    else {
      pmVar1 = ((tbinptr)psize_local)->parent;
      if (((tbinptr)psize_local)->bk == (tbinptr)psize_local) {
        CP = ((tbinptr)psize_local)->child + 1;
        F_1 = ((tbinptr)psize_local)->child[1];
        if (F_1 == (malloc_tree_chunk *)0x0) {
          CP = ((tbinptr)psize_local)->child;
          F_1 = ((tbinptr)psize_local)->child[0];
          if (F_1 == (malloc_tree_chunk *)0x0) goto LAB_0010c64c;
        }
        while( true ) {
          H = F_1->child + 1;
          bVar13 = true;
          if (F_1->child[1] == (malloc_tree_chunk *)0x0) {
            H = F_1->child;
            bVar13 = F_1->child[0] != (malloc_tree_chunk *)0x0;
          }
          if (!bVar13) break;
          CP = H;
          F_1 = *H;
        }
        if (CP < m->least_addr) {
          abort();
        }
        *CP = (tchunkptr)0x0;
      }
      else {
        pmVar2 = ((tbinptr)psize_local)->fd;
        F_1 = ((tbinptr)psize_local)->bk;
        bVar13 = false;
        if (((malloc_tree_chunk *)m->least_addr <= pmVar2) &&
           (bVar13 = false, pmVar2->bk == (tbinptr)psize_local)) {
          bVar13 = F_1->fd == (tbinptr)psize_local;
        }
        if (!bVar13) {
          abort();
        }
        pmVar2->bk = F_1;
        F_1->fd = pmVar2;
      }
LAB_0010c64c:
      if (pmVar1 != (malloc_tree_chunk *)0x0) {
        if ((tbinptr)psize_local == m->treebins[((tbinptr)psize_local)->index]) {
          m->treebins[((tbinptr)psize_local)->index] = F_1;
          if (F_1 == (tchunkptr)0x0) {
            m->treemap = (1 << ((byte)((tbinptr)psize_local)->index & 0x1f) ^ 0xffffffffU) &
                         m->treemap;
          }
        }
        else {
          if (pmVar1 < (malloc_tree_chunk *)m->least_addr) {
            abort();
          }
          if (pmVar1->child[0] == (tbinptr)psize_local) {
            pmVar1->child[0] = F_1;
          }
          else {
            pmVar1->child[1] = F_1;
          }
        }
        if (F_1 != (tchunkptr)0x0) {
          if (F_1 < (tchunkptr)m->least_addr) {
            abort();
          }
          F_1->parent = pmVar1;
          pmVar1 = ((tbinptr)psize_local)->child[0];
          if (pmVar1 != (malloc_tree_chunk *)0x0) {
            if (pmVar1 < (malloc_tree_chunk *)m->least_addr) {
              abort();
            }
            F_1->child[0] = pmVar1;
            pmVar1->parent = F_1;
          }
          pmVar1 = ((tbinptr)psize_local)->child[1];
          if (pmVar1 != (malloc_tree_chunk *)0x0) {
            if (pmVar1 < (malloc_tree_chunk *)m->least_addr) {
              abort();
            }
            F_1->child[1] = pmVar1;
            pmVar1->parent = F_1;
          }
        }
      }
    }
  }
  if (pmVar7 < (tbinptr)m->least_addr) {
    abort();
  }
  if ((pmVar7->head & 2) != 0) {
    pmVar7->head = pmVar7->head & 0xfffffffffffffffe;
    *(ulong *)(psize_local + 8) = (ulong)next | 1;
    *(mchunkptr *)((long)&next->prev_foot + psize_local) = next;
    goto LAB_0010cf7d;
  }
  if (pmVar7 == (tbinptr)m->top) {
    uVar8 = (long)&next->prev_foot + m->topsize;
    m->topsize = uVar8;
    m->top = (mchunkptr)psize_local;
    *(ulong *)(psize_local + 8) = uVar8 | 1;
    if ((mchunkptr)psize_local != m->dv) {
      return;
    }
    m->dv = (mchunkptr)0x0;
    m->dvsize = 0;
    return;
  }
  if (pmVar7 == (tbinptr)m->dv) {
    uVar8 = (long)&next->prev_foot + m->dvsize;
    m->dvsize = uVar8;
    m->dv = (mchunkptr)psize_local;
    *(ulong *)(psize_local + 8) = uVar8 | 1;
    *(ulong *)(psize_local + uVar8) = uVar8;
    return;
  }
  uVar8 = pmVar7->head;
  next = (mchunkptr)((long)&next->prev_foot + (uVar8 & 0xfffffffffffffff8));
  if (uVar8 >> 3 < 0x20) {
    pmVar1 = pmVar7->fd;
    pmVar2 = pmVar7->bk;
    iVar5 = (int)(uVar8 >> 3);
    bVar13 = true;
    if ((pmVar1 != (malloc_tree_chunk *)(m->smallbins + (uint)(iVar5 << 1))) &&
       (bVar13 = false, (malloc_tree_chunk *)m->least_addr <= pmVar1)) {
      bVar13 = pmVar1->bk == pmVar7;
    }
    if (!bVar13) {
      abort();
    }
    if (pmVar2 == pmVar1) {
      m->smallmap = (1 << ((byte)(uVar8 >> 3) & 0x1f) ^ 0xffffffffU) & m->smallmap;
    }
    else {
      bVar13 = true;
      if ((pmVar2 != (malloc_tree_chunk *)(m->smallbins + (uint)(iVar5 << 1))) &&
         (bVar13 = false, (malloc_tree_chunk *)m->least_addr <= pmVar2)) {
        bVar13 = pmVar2->fd == pmVar7;
      }
      if (!bVar13) {
        abort();
      }
      pmVar1->bk = pmVar2;
      pmVar2->fd = pmVar1;
    }
  }
  else {
    pmVar1 = pmVar7->parent;
    if (pmVar7->bk == pmVar7) {
      CP_1 = pmVar7->child + 1;
      F_3 = pmVar7->child[1];
      if (F_3 == (malloc_tree_chunk *)0x0) {
        CP_1 = pmVar7->child;
        F_3 = pmVar7->child[0];
        if (F_3 == (malloc_tree_chunk *)0x0) goto LAB_0010cd12;
      }
      while( true ) {
        H_1 = F_3->child + 1;
        bVar13 = true;
        if (F_3->child[1] == (malloc_tree_chunk *)0x0) {
          H_1 = F_3->child;
          bVar13 = F_3->child[0] != (malloc_tree_chunk *)0x0;
        }
        if (!bVar13) break;
        CP_1 = H_1;
        F_3 = *H_1;
      }
      if (CP_1 < m->least_addr) {
        abort();
      }
      *CP_1 = (tchunkptr)0x0;
    }
    else {
      pmVar2 = pmVar7->fd;
      F_3 = pmVar7->bk;
      bVar13 = false;
      if (((malloc_tree_chunk *)m->least_addr <= pmVar2) && (bVar13 = false, pmVar2->bk == pmVar7))
      {
        bVar13 = F_3->fd == pmVar7;
      }
      if (!bVar13) {
        abort();
      }
      pmVar2->bk = F_3;
      F_3->fd = pmVar2;
    }
LAB_0010cd12:
    if (pmVar1 != (malloc_tree_chunk *)0x0) {
      if (pmVar7 == m->treebins[pmVar7->index]) {
        m->treebins[pmVar7->index] = F_3;
        if (F_3 == (tchunkptr)0x0) {
          m->treemap = (1 << ((byte)pmVar7->index & 0x1f) ^ 0xffffffffU) & m->treemap;
        }
      }
      else {
        if (pmVar1 < (malloc_tree_chunk *)m->least_addr) {
          abort();
        }
        if (pmVar1->child[0] == pmVar7) {
          pmVar1->child[0] = F_3;
        }
        else {
          pmVar1->child[1] = F_3;
        }
      }
      if (F_3 != (tchunkptr)0x0) {
        if (F_3 < (tchunkptr)m->least_addr) {
          abort();
        }
        F_3->parent = pmVar1;
        pmVar1 = pmVar7->child[0];
        if (pmVar1 != (malloc_tree_chunk *)0x0) {
          if (pmVar1 < (malloc_tree_chunk *)m->least_addr) {
            abort();
          }
          F_3->child[0] = pmVar1;
          pmVar1->parent = F_3;
        }
        pmVar1 = pmVar7->child[1];
        if (pmVar1 != (malloc_tree_chunk *)0x0) {
          if (pmVar1 < (malloc_tree_chunk *)m->least_addr) {
            abort();
          }
          F_3->child[1] = pmVar1;
          pmVar1->parent = F_3;
        }
      }
    }
  }
  *(ulong *)(psize_local + 8) = (ulong)next | 1;
  *(mchunkptr *)((long)&next->prev_foot + psize_local) = next;
  if ((mchunkptr)psize_local == m->dv) {
    m->dvsize = (size_t)next;
    return;
  }
LAB_0010cf7d:
  if ((ulong)next >> 3 < 0x20) {
    pmVar9 = (tchunkptr)(m->smallbins + (uint)((int)((ulong)next >> 3) << 1));
    bVar12 = (byte)((ulong)next >> 3);
    if ((m->smallmap & 1 << (bVar12 & 0x1f)) == 0) {
      m->smallmap = 1 << (bVar12 & 0x1f) | m->smallmap;
      TP_2 = pmVar9;
    }
    else {
      if (pmVar9->fd < (malloc_tree_chunk *)m->least_addr) {
        abort();
      }
      TP_2 = pmVar9->fd;
    }
    pmVar9->fd = (malloc_tree_chunk *)psize_local;
    TP_2->bk = (malloc_tree_chunk *)psize_local;
    *(tchunkptr *)(psize_local + 0x10) = TP_2;
    *(tchunkptr *)(psize_local + 0x18) = pmVar9;
  }
  else {
    uVar6 = (uint)((ulong)next >> 8);
    if (uVar6 == 0) {
      K = 0;
    }
    else if (uVar6 < 0x10000) {
      uVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      iVar5 = 0x1f - (uVar4 ^ 0x1f);
      K = iVar5 * 2 + ((uint)((ulong)next >> ((char)iVar5 + 7U & 0x3f)) & 1);
    }
    else {
      K = 0x1f;
    }
    ppmVar10 = m->treebins + K;
    *(uint *)(psize_local + 0x38) = K;
    *(undefined8 *)(psize_local + 0x28) = 0;
    *(undefined8 *)(psize_local + 0x20) = 0;
    if ((m->treemap & 1 << ((byte)K & 0x1f)) == 0) {
      m->treemap = 1 << ((byte)K & 0x1f) | m->treemap;
      *ppmVar10 = (tbinptr)psize_local;
      *(tbinptr **)(psize_local + 0x30) = ppmVar10;
      *(size_t *)(psize_local + 0x18) = psize_local;
      *(size_t *)(psize_local + 0x10) = psize_local;
    }
    else {
      K_1 = (size_t)*ppmVar10;
      if (K == 0x1f) {
        bVar12 = 0;
      }
      else {
        bVar12 = 0x3f - ((char)(K >> 1) + '\x06');
      }
      C = (tchunkptr *)((long)next << (bVar12 & 0x3f));
      while ((mchunkptr)(*(ulong *)(K_1 + 8) & 0xfffffffffffffff8) != next) {
        psVar11 = (size_t *)(K_1 + 0x20 + ((long)C >> 0x3f) * -8);
        C = (tchunkptr *)((long)C << 1);
        if (*psVar11 == 0) {
          if (m->least_addr <= psVar11) {
            *psVar11 = psize_local;
            *(size_t *)(psize_local + 0x30) = K_1;
            *(size_t *)(psize_local + 0x18) = psize_local;
            *(size_t *)(psize_local + 0x10) = psize_local;
            return;
          }
          abort();
        }
        K_1 = *psVar11;
      }
      pcVar3 = *(char **)(K_1 + 0x10);
      bVar13 = false;
      if (m->least_addr <= K_1) {
        bVar13 = m->least_addr <= pcVar3;
      }
      if (!bVar13) {
        abort();
      }
      *(size_t *)(pcVar3 + 0x18) = psize_local;
      *(size_t *)(K_1 + 0x10) = psize_local;
      *(char **)(psize_local + 0x10) = pcVar3;
      *(size_t *)(psize_local + 0x18) = K_1;
      *(undefined8 *)(psize_local + 0x30) = 0;
    }
  }
  return;
}

Assistant:

static void dispose_chunk(mstate m, mchunkptr p, size_t psize) {
  mchunkptr next = chunk_plus_offset(p, psize);
  if (!pinuse(p)) {
    mchunkptr prev;
    size_t prevsize = p->prev_foot;
    if (is_mmapped(p)) {
      psize += prevsize + MMAP_FOOT_PAD;
      if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
        m->footprint -= psize;
      return;
    }
    prev = chunk_minus_offset(p, prevsize);
    psize += prevsize;
    p = prev;
    if (RTCHECK(ok_address(m, prev))) { /* consolidate backward */
      if (p != m->dv) {
        unlink_chunk(m, p, prevsize);
      }
      else if ((next->head & INUSE_BITS) == INUSE_BITS) {
        m->dvsize = psize;
        set_free_with_pinuse(p, psize, next);
        return;
      }
    }
    else {
      CORRUPTION_ERROR_ACTION(m);
      return;
    }
  }
  if (RTCHECK(ok_address(m, next))) {
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == m->top) {
        size_t tsize = m->topsize += psize;
        m->top = p;
        p->head = tsize | PINUSE_BIT;
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        return;
      }
      else if (next == m->dv) {
        size_t dsize = m->dvsize += psize;
        m->dv = p;
        set_size_and_pinuse_of_free_chunk(p, dsize);
        return;
      }
      else {
        size_t nsize = chunksize(next);
        psize += nsize;
        unlink_chunk(m, next, nsize);
        set_size_and_pinuse_of_free_chunk(p, psize);
        if (p == m->dv) {
          m->dvsize = psize;
          return;
        }
      }
    }
    else {
      set_free_with_pinuse(p, psize, next);
    }
    insert_chunk(m, p, psize);
  }
  else {
    CORRUPTION_ERROR_ACTION(m);
  }
}